

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint *z;
  int iVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  DateTime x;
  undefined1 local_48;
  uint local_47;
  undefined1 local_43;
  char local_42;
  char local_41;
  undefined1 local_40;
  char local_3f;
  char local_3e;
  undefined1 local_3d;
  char local_3c;
  char local_3b;
  undefined1 local_3a;
  char local_39;
  char local_38;
  undefined1 local_37;
  char local_36;
  char local_35;
  undefined1 local_34;
  char local_33;
  char local_32;
  char local_31;
  undefined1 local_30;
  long local_20;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = isDate(context,argc,argv,&x);
  if (iVar10 == 0) {
    computeYMD_HMS(&x);
    uVar9 = -x.Y;
    if (0 < x.Y) {
      uVar9 = x.Y;
    }
    uVar13 = (ulong)uVar9;
    uVar1 = (uVar13 / 10) % 10;
    uVar2 = ((ulong)uVar9 / 100) % 10;
    uVar3 = (uVar13 / 1000) % 10;
    uVar8 = (ushort)uVar3;
    bVar4 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar3 - (0xff < uVar8);
    uVar8 = (ushort)uVar2;
    bVar5 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar2 - (0xff < uVar8);
    uVar8 = (ushort)uVar1;
    bVar6 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar1 - (0xff < uVar8);
    uVar8 = (ushort)(uVar13 % 10);
    bVar7 = (uVar8 != 0) * (uVar8 < 0x100) * (char)(uVar13 % 10) - (0xff < uVar8);
    local_47 = CONCAT13((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                        CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                 CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                          (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4))))
               | (uint)DAT_001a5c60;
    local_43 = 0x2d;
    local_42 = (char)((long)((ulong)(uint)((int)((long)x.M / 10) >> 0x1f) << 0x20 |
                            (long)x.M / 10 & 0xffffffffU) % 10) + '0';
    local_41 = (char)(x.M % 10) + '0';
    local_40 = 0x2d;
    local_3f = (char)((long)((ulong)(uint)((int)((long)x.D / 10) >> 0x1f) << 0x20 |
                            (long)x.D / 10 & 0xffffffffU) % 10) + '0';
    local_3e = (char)(x.D % 10) + '0';
    local_3d = 0x20;
    local_3c = (char)((long)((ulong)(uint)((int)((long)x.h / 10) >> 0x1f) << 0x20 |
                            (long)x.h / 10 & 0xffffffffU) % 10) + '0';
    local_3b = (char)(x.h % 10) + '0';
    local_3a = 0x3a;
    local_39 = (char)((long)((ulong)(uint)((int)((long)x.m / 10) >> 0x1f) << 0x20 |
                            (long)x.m / 10 & 0xffffffffU) % 10) + '0';
    local_38 = (char)(x.m % 10) + '0';
    local_37 = 0x3a;
    if (x.useSubsec == '\0') {
      iVar11 = (int)x.s;
      iVar10 = iVar11 / 10;
      iVar12 = 0x14;
      local_34 = 0;
    }
    else {
      iVar12 = (int)(x.s * 1000.0 + 0.5);
      iVar10 = iVar12 / 10000;
      iVar11 = iVar12 / 1000;
      local_33 = (char)((long)((ulong)(uint)((int)((long)iVar12 / 100) >> 0x1f) << 0x20 |
                              (long)iVar12 / 100 & 0xffffffffU) % 10) + '0';
      local_32 = (char)((long)((ulong)(uint)((int)((long)iVar12 / 10) >> 0x1f) << 0x20 |
                              (long)iVar12 / 10 & 0xffffffffU) % 10) + '0';
      local_31 = (char)(iVar12 % 10) + '0';
      local_30 = 0;
      iVar12 = 0x18;
      local_34 = 0x2e;
    }
    local_35 = (char)(iVar11 % 10) + '0';
    local_36 = (char)(iVar10 % 10) + '0';
    if (x.Y < 0) {
      z = (uint *)&local_48;
      local_48 = 0x2d;
    }
    else {
      z = &local_47;
      iVar12 = iVar12 + -1;
    }
    sqlite3_result_text(context,(char *)z,iVar12,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s, n;
    char zBuf[32];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[18] = '0' + (s/10000)%10;
      zBuf[19] = '0' + (s/1000)%10;
      zBuf[20] = '.';
      zBuf[21] = '0' + (s/100)%10;
      zBuf[22] = '0' + (s/10)%10;
      zBuf[23] = '0' + (s)%10;
      zBuf[24] = 0;
      n = 24;
    }else{
      s = (int)x.s;
      zBuf[18] = '0' + (s/10)%10;
      zBuf[19] = '0' + (s)%10;
      zBuf[20] = 0;
      n = 20;
    }
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], n-1, SQLITE_TRANSIENT);
    }
  }
}